

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

bool __thiscall QHostAddressPrivate::parse(QHostAddressPrivate *this,QString *ipString)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  char cVar5;
  undefined1 *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QStringView local_88;
  quint32 maybeIp4;
  char16_t *pcStack_70;
  qsizetype local_68;
  QStringView local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->protocol = -1;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::simplified_helper((QString *)&local_a8);
  if ((undefined1 *)local_a8.size == (undefined1 *)0x0) {
    cVar5 = '\0';
  }
  else {
    bVar4 = QString::contains((QString *)&local_a8,(QChar)0x3a,CaseSensitive);
    if (bVar4) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.m_size = local_a8.size;
      local_58.m_data = local_a8.ptr;
      puVar6 = (undefined1 *)QStringView::lastIndexOf(&local_58,(QChar)0x25,CaseSensitive);
      if (puVar6 == (undefined1 *)0xffffffffffffffff) {
        QString::clear(&this->scopeId);
      }
      else {
        local_88 = QStringView::mid(&local_58,(qsizetype)(puVar6 + 1),-1);
        QStringView::toString((QString *)&maybeIp4,&local_88);
        pDVar2 = (this->scopeId).d.d;
        pcVar3 = (this->scopeId).d.ptr;
        (this->scopeId).d.d = _maybeIp4;
        (this->scopeId).d.ptr = pcStack_70;
        qVar1 = (this->scopeId).d.size;
        (this->scopeId).d.size = local_68;
        _maybeIp4 = pDVar2;
        pcStack_70 = pcVar3;
        local_68 = qVar1;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&maybeIp4);
        local_58.m_size = (qsizetype)puVar6;
      }
      lVar7 = QIPAddressUtils::parseIp6
                        ((unsigned_char *)&local_48,(QChar *)local_58.m_data,
                         (QChar *)(local_58.m_data + local_58.m_size));
      if (lVar7 == 0) {
        setAddress(this,(quint8 *)&local_48);
        cVar5 = '\x01';
        goto LAB_0019fedc;
      }
    }
    _maybeIp4 = (Data *)((ulong)_maybeIp4 & 0xffffffff00000000);
    cVar5 = QIPAddressUtils::parseIp4
                      (&maybeIp4,(QChar *)local_a8.ptr,(QChar *)(local_a8.ptr + local_a8.size));
    if (cVar5 != '\0') {
      setAddress(this,maybeIp4);
    }
  }
LAB_0019fedc:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QHostAddressPrivate::parse(const QString &ipString)
{
    protocol = QHostAddress::UnknownNetworkLayerProtocol;
    QString a = ipString.simplified();
    if (a.isEmpty())
        return false;

    // All IPv6 addresses contain a ':', and may contain a '.'.
    if (a.contains(u':')) {
        quint8 maybeIp6[16];
        if (parseIp6(a, maybeIp6, &scopeId)) {
            setAddress(maybeIp6);
            return true;
        }
    }

    quint32 maybeIp4 = 0;
    if (QIPAddressUtils::parseIp4(maybeIp4, a.constBegin(), a.constEnd())) {
        setAddress(maybeIp4);
        return true;
    }

    return false;
}